

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::decompressTexture
               (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *levelDatas,
               vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
               *levelAccesses,RenderContext *renderContext,ImageInfo *info,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data)

{
  bool bVar1;
  bool bVar2;
  CompressedTexFormat format;
  ContextType ctxType;
  int iVar3;
  ContextInfo *this;
  long lVar4;
  int level;
  long lVar5;
  long lVar6;
  TexDecompressionParams decompressParams;
  CompressedTexFormat compressedFormat;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_78;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_70;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_68;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  TextureFormat decompressedFormat;
  IVec3 size;
  IVec3 levelPixelSize;
  
  local_78 = levelDatas;
  local_70 = levelAccesses;
  local_68 = data;
  format = glu::mapGLCompressedTexFormat(info->m_format);
  compressedFormat = format;
  decompressedFormat = tcu::getUncompressedFormat(format);
  tcu::Vector<int,_3>::Vector(&size,&info->m_size);
  ctxType.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  this = glu::ContextInfo::create(renderContext);
  decompressParams.astcMode = ASTCMODE_LAST;
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data.ptr =
       this;
  bVar2 = tcu::isAstcFormat(format);
  if (bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_hdr");
    if (bVar2) {
      bVar2 = tcu::isAstcSRGBFormat(format);
      if (!bVar2) {
        decompressParams.astcMode = ASTCMODE_HDR;
        goto LAB_013a3d04;
      }
    }
    if (!bVar1) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (ctxInfo.
                         super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.
                         m_data.ptr,"GL_KHR_texture_compression_astc_ldr");
      if (!bVar1) goto LAB_013a3d04;
    }
    decompressParams.astcMode = ASTCMODE_LDR;
  }
LAB_013a3d04:
  iVar3 = getLevelCount(info);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(local_78,(long)iVar3);
  iVar3 = getLevelCount(info);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
            (local_70,(long)iVar3);
  lVar4 = 0;
  lVar6 = 0;
  lVar5 = 0;
  while( true ) {
    iVar3 = getLevelCount(info);
    if (iVar3 <= lVar5) break;
    getLevelSize((anon_unknown_0 *)&levelPixelSize,info->m_target,&size,(int)lVar5);
    decompressTextureLevel
              (&decompressParams,
               (ArrayBuffer<unsigned_char,_1UL,_1UL> *)
               ((long)&((local_78->
                        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar6),
               (PixelBufferAccess *)
               ((long)(((local_70->
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                      m_size.m_data + lVar4 + -8),&compressedFormat,&decompressedFormat,
               &levelPixelSize,
               *(void **)((long)&((local_68->
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar6));
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x10;
    lVar4 = lVar4 + 0x28;
  }
  de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniqueBase
            (&ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>);
  return;
}

Assistant:

void decompressTexture (vector<ArrayBuffer<deUint8> >&			levelDatas,
						vector<tcu::PixelBufferAccess>&			levelAccesses,
						glu::RenderContext&						renderContext,
						const ImageInfo&						info,
						const vector<ArrayBuffer<deUint8> >&	data)
{
	const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(info.getFormat());
	const tcu::TextureFormat		decompressedFormat	= tcu::getUncompressedFormat(compressedFormat);
	const IVec3						size				= info.getSize();
	const bool						isES32				= glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2));

	de::UniquePtr<glu::ContextInfo>	ctxInfo				(glu::ContextInfo::create(renderContext));
	tcu::TexDecompressionParams		decompressParams;

	if (tcu::isAstcFormat(compressedFormat))
	{
		if (ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_hdr") && !tcu::isAstcSRGBFormat(compressedFormat))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_HDR);
		else if (isES32 || ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR);
		else
			DE_ASSERT(false);
	}

	levelDatas.resize(getLevelCount(info));
	levelAccesses.resize(getLevelCount(info));

	for (int level = 0; level < getLevelCount(info); level++)
	{
		const IVec3					levelPixelSize	= getLevelSize(info.getTarget(), size, level);
		de::ArrayBuffer<deUint8>&	levelData		= levelDatas[level];
		tcu::PixelBufferAccess&		levelAccess		= levelAccesses[level];

		decompressTextureLevel(decompressParams, levelData, levelAccess, compressedFormat, decompressedFormat, levelPixelSize, data[level].getPtr());
	}
}